

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O2

bool __thiscall
EthBasePort::ReceiveResponseNode
          (EthBasePort *this,nodeid_t node,quadlet_t *rdata,uint nbytes,uint8_t fw_tl,
          nodeid_t *src_node)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ostream *poVar7;
  EthBasePort *this_00;
  uint uVar8;
  quadlet_t *qpacket;
  uchar *puVar9;
  uchar *puVar10;
  
  puVar10 = (this->super_BasePort).GenericBuffer;
  uVar2 = (*(this->super_BasePort)._vptr_BasePort[0x18])();
  iVar3 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,4);
  iVar4 = (*(this->super_BasePort)._vptr_BasePort[0x16])(this);
  uVar8 = iVar4 + iVar3 + nbytes;
  uVar5 = (*(this->super_BasePort)._vptr_BasePort[0x18])(this);
  uVar6 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,4);
  puVar9 = (this->super_BasePort).ReadBufferBroadcast;
  puVar10 = puVar10 + uVar2;
  if ((uchar *)((long)rdata + (-(ulong)uVar6 - (ulong)uVar5)) == puVar9) {
    puVar10 = puVar9;
  }
  uVar2 = (*(this->super_BasePort)._vptr_BasePort[0x2e])(this,puVar10,(ulong)uVar8);
  if (uVar2 == uVar8) {
    ProcessExtraData(this,puVar10 + ((ulong)uVar8 - 8));
    iVar3 = (*(this->super_BasePort)._vptr_BasePort[0x32])(this,puVar10,0);
    if ((char)iVar3 == '\0') {
      return false;
    }
    this_00 = this;
    uVar2 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,3);
    puVar9 = puVar10 + uVar2;
    ByteswapQuadlets(this_00,puVar9,0x14);
    bVar1 = CheckFirewirePacket(this,puVar9,(ulong)nbytes,node,7,(uint)fw_tl);
    if (bVar1) {
      if (src_node != (nodeid_t *)0x0) {
        *src_node = *(ushort *)(puVar9 + 6) & 0x3f;
      }
      uVar2 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,4);
      if ((quadlet_t *)(puVar10 + uVar2) == rdata) {
        return true;
      }
      (this->super_BasePort).rtRead = false;
      memcpy(rdata,puVar10 + uVar2,(ulong)nbytes);
      return true;
    }
  }
  else {
    std::operator<<((this->super_BasePort).outStr,"ReadBlock: failed to receive read response");
    if ((this->super_BasePort).Node2Board[node] < 0x10) {
      poVar7 = std::operator<<((this->super_BasePort).outStr," from board ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    }
    poVar7 = std::operator<<((this->super_BasePort).outStr,": return value = ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar2);
    poVar7 = std::operator<<(poVar7,", expected = ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  return false;
}

Assistant:

bool EthBasePort::ReceiveResponseNode(nodeid_t node, quadlet_t *rdata,
                                      unsigned int nbytes, uint8_t fw_tl, nodeid_t *src_node)
{
    // Packet to receive
    unsigned char *packet = GenericBuffer+GetReadQuadAlign();;
    unsigned int packetSize = GetPrefixOffset(RD_FW_BDATA) + nbytes + GetReadPostfixSize();

    // Check for real-time read
    unsigned char *rdata_base = reinterpret_cast<unsigned char *>(rdata)-GetReadQuadAlign()-GetPrefixOffset(RD_FW_BDATA);
    if (rdata_base == ReadBufferBroadcast) {
        packet = ReadBufferBroadcast;
    }

    int nRecv = PacketReceive(packet, packetSize);
    if (nRecv != static_cast<int>(packetSize)) {
        outStr << "ReadBlock: failed to receive read response";
        unsigned char boardId = Node2Board[node];
        if (boardId < BoardIO::MAX_BOARDS)
            outStr << " from board " << static_cast<unsigned int>(boardId);
        outStr << ": return value = " << nRecv
               << ", expected = " << packetSize << std::endl;
        return false;
    }

    ProcessExtraData(packet+packetSize-FW_EXTRA_SIZE);

    if (!CheckEthernetHeader(packet, false))
        return false;
    // Byteswap Firewire header
    unsigned char *packetFw = packet + GetPrefixOffset(RD_FW_HEADER);
    ByteswapQuadlets(packetFw, FW_BRESPONSE_HEADER_SIZE);
    if (!CheckFirewirePacket(packetFw, nbytes, node, EthBasePort::BRESPONSE, fw_tl))
        return false;
    if (src_node)
        GetFirewireHeaderInfo(packetFw, src_node, 0, 0);

    const quadlet_t *packet_data = reinterpret_cast<const quadlet_t *>(packet+GetPrefixOffset(RD_FW_BDATA));
    if (rdata != packet_data) {
        rtRead = false;
        memcpy(rdata, packet_data, nbytes);
    }
    return true;
}